

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandReadWlc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  Wlc_Ntk_t *pWVar3;
  char *pcVar4;
  char *pcVar5;
  uint fOldParser;
  uint local_34;
  
  fOldParser = 0;
  Extra_UtilGetoptReset();
  local_34 = 0;
  bVar1 = false;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"opvh"), iVar2 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x70) {
      fOldParser = fOldParser ^ 1;
    }
    else {
      if (iVar2 != 0x6f) {
        Abc_Print(-2,"usage: %%read [-opvh] <file_name>\n");
        Abc_Print(-2,"\t         reads word-level design from Verilog file\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fOldParser == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-o     : toggle using old SMT-LIB parser [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_34 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-p     : toggle printing parse SMT-LIB tree [default = %s]\n",pcVar4);
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      local_34 = local_34 ^ 1;
    }
  }
  if (globalUtilOptind + 1 == argc) {
    pcVar4 = argv[globalUtilOptind];
    __stream = fopen(pcVar4,"r");
    if (__stream == (FILE *)0x0) {
      Abc_Print(1,"Cannot open input file \"%s\". ",pcVar4);
      pcVar4 = Extra_FileGetSimilarName(pcVar4,".v",".smt",".smt2",(char *)0x0,(char *)0x0);
      if (pcVar4 != (char *)0x0) {
        Abc_Print(1,"Did you mean \"%s\"?",pcVar4);
      }
      Abc_Print(1,"\n");
      return 0;
    }
    fclose(__stream);
    pcVar5 = Extra_FileNameExtension(pcVar4);
    iVar2 = strcmp(pcVar5,"v");
    if (iVar2 == 0) {
      pWVar3 = Wlc_ReadVer(pcVar4);
    }
    else {
      pcVar5 = Extra_FileNameExtension(pcVar4);
      iVar2 = strcmp(pcVar5,"smt");
      if (iVar2 != 0) {
        pcVar5 = Extra_FileNameExtension(pcVar4);
        iVar2 = strcmp(pcVar5,"smt2");
        if (iVar2 != 0) {
          pcVar4 = "Abc_CommandReadWlc(): Unknown file extension.";
          goto LAB_0030b63c;
        }
      }
      pWVar3 = Wlc_ReadSmt(pcVar4,fOldParser,local_34);
    }
    if ((Wlc_Ntk_t *)pAbc->pAbcWlc != (Wlc_Ntk_t *)0x0) {
      Wlc_NtkFree((Wlc_Ntk_t *)pAbc->pAbcWlc);
    }
    pAbc->pAbcWlc = pWVar3;
  }
  else {
    pcVar4 = "Abc_CommandReadWlc(): Input file name should be given on the command line.";
LAB_0030b63c:
    puts(pcVar4);
  }
  return 0;
}

Assistant:

int Abc_CommandReadWlc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Wlc_Ntk_t * pNtk = NULL;
    char * pFileName = NULL;
    int fOldParser   =    0;
    int fPrintTree   =    0;
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "opvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'o':
            fPrintTree ^= 1;
            break;
        case 'p':
            fOldParser ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "Abc_CommandReadWlc(): Input file name should be given on the command line.\n" );
        return 0;
    }
    // get the file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( 1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".v", ".smt", ".smt2", NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 0;
    }
    fclose( pFile );

    // perform reading
    if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
        pNtk = Wlc_ReadVer( pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "smt" ) || !strcmp( Extra_FileNameExtension(pFileName), "smt2" )  )
        pNtk = Wlc_ReadSmt( pFileName, fOldParser, fPrintTree );
    else
    {
        printf( "Abc_CommandReadWlc(): Unknown file extension.\n" );
        return 0;
    }
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%read [-opvh] <file_name>\n" );
    Abc_Print( -2, "\t         reads word-level design from Verilog file\n" );
    Abc_Print( -2, "\t-o     : toggle using old SMT-LIB parser [default = %s]\n", fOldParser? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle printing parse SMT-LIB tree [default = %s]\n", fPrintTree? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}